

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManResubAddNode(Gia_ResbMan_t *p,int iLit0,int iLit1,int Type)

{
  Vec_Int_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar2 = iLit1;
  uVar1 = iLit0;
  if (iLit1 < iLit0 != (Type == 2)) {
    uVar2 = iLit0;
    uVar1 = iLit1;
  }
  if (iLit0 == iLit1) {
    __assert_fail("iLit0 != iLit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x459,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
  }
  p_00 = p->vGates;
  if (Type == 2) {
    if ((int)uVar1 <= (int)uVar2) {
      __assert_fail("iFan0 > iFan1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x45b,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
    }
  }
  else if ((int)uVar2 <= (int)uVar1) {
    __assert_fail("iFan0 < iFan1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x45d,"int Gia_ManResubAddNode(Gia_ResbMan_t *, int, int, int)");
  }
  if ((-1 < (int)uVar1) && (-1 < (int)uVar2)) {
    iVar3 = p_00->nSize / 2 + p->vDivs->nSize;
    uVar4 = (uint)(Type == 1);
    Vec_IntPush(p_00,uVar1 ^ uVar4);
    Vec_IntPush(p_00,uVar2 ^ uVar4);
    if (iVar3 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    return (uint)(Type == 1) + iVar3 * 2;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Gia_ManResubAddNode( Gia_ResbMan_t * p, int iLit0, int iLit1, int Type )
{
    int iNode = Vec_PtrSize(p->vDivs) + Vec_IntSize(p->vGates)/2;
    int fFlip = (Type == 2) ^ (iLit0 > iLit1);
    int iFan0 = fFlip ? iLit1 : iLit0;
    int iFan1 = fFlip ? iLit0 : iLit1;
    assert( iLit0 != iLit1 );
    if ( Type == 2 )
        assert( iFan0 > iFan1 );
    else
        assert( iFan0 < iFan1 );
    Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iFan0, Type==1), Abc_LitNotCond(iFan1, Type==1) );
    return Abc_Var2Lit( iNode, Type==1 );
}